

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall mjs::interpreter::impl::put_value(impl *this,value *v,value *w)

{
  bool bVar1;
  value_type vVar2;
  native_error_exception *this_00;
  object_ptr *p;
  string *psVar3;
  object *poVar4;
  gc_heap_ptr<mjs::object> local_248;
  wstring_view local_238;
  undefined1 local_228 [8];
  object_ptr b;
  reference *r;
  wstring local_208 [32];
  wstring_view local_1e8;
  wstring local_1d8;
  wstring_view local_1b8 [2];
  wostringstream local_198 [8];
  wostringstream woss;
  value *w_local;
  value *v_local;
  impl *this_local;
  
  vVar2 = value::type(v);
  if (vVar2 != reference) {
    std::__cxx11::wostringstream::wostringstream(local_198);
    debug_print((wostream *)local_198,v,4,0x7fffffff,0);
    std::operator<<((wostream *)local_198," is not a reference");
    this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
    stack_trace_abi_cxx11_(&local_1d8,this);
    local_1b8[0] = (wstring_view)
                   std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_1d8);
    std::__cxx11::wostringstream::str();
    local_1e8 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_208);
    native_error_exception::native_error_exception(this_00,reference,local_1b8,&local_1e8);
    __cxa_throw(this_00,&native_error_exception::typeinfo,
                native_error_exception::~native_error_exception);
  }
  b.super_gc_heap_ptr_untyped._8_8_ = value::reference_value(v);
  p = reference::base((reference *)b.super_gc_heap_ptr_untyped._8_8_);
  gc_heap_ptr<mjs::object>::gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_228,p);
  if ((this->strict_mode_ & 1U) != 0) {
    psVar3 = reference::property_name((reference *)b.super_gc_heap_ptr_untyped._8_8_);
    local_238 = string::view(psVar3);
    check_strict_mode_put(this,(object_ptr *)local_228,local_238);
  }
  bVar1 = gc_heap_ptr_untyped::operator_cast_to_bool((gc_heap_ptr_untyped *)local_228);
  if (!bVar1) {
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::global_object,void>(&local_248,&this->global_);
    gc_heap_ptr<mjs::object>::operator=((gc_heap_ptr<mjs::object> *)local_228,&local_248);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_248);
  }
  poVar4 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_228);
  psVar3 = reference::property_name((reference *)b.super_gc_heap_ptr_untyped._8_8_);
  (*poVar4->_vptr_object[1])(poVar4,psVar3,w,0);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_228);
  return;
}

Assistant:

void put_value(const value& v, const value& w) const {
        if (v.type() != value_type::reference) {
            std::wostringstream woss;
            debug_print(woss, v, 4);
            woss << " is not a reference";
            throw native_error_exception{native_error_type::reference, stack_trace(), woss.str()};
        }
        auto& r = v.reference_value();
        auto b = r.base();
        if (strict_mode_) {
            check_strict_mode_put(b, r.property_name().view());
        }
        if (!b) {
            b = global_;
        }
        b->put(r.property_name(), w);
    }